

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

int eia608_parse_preamble
              (uint16_t cc_data,int *row,int *col,eia608_style_t *style,int *chan,int *underline)

{
  eia608_style_t eVar1;
  
  *row = eia608_row_map[(cc_data & 0x20) >> 5 | (cc_data & 0x700) >> 7];
  *chan = (cc_data & 0x800) >> 0xb;
  *underline = cc_data & 1;
  eVar1 = eia608_style_white;
  if ((cc_data & 0x10) == 0) {
    eVar1 = (cc_data & 0xe) >> 1;
  }
  *style = eVar1;
  *col = (uint)cc_data * 2 & (int)((uint)cc_data << 0x1b) >> 0x1f & 0x1c;
  return 1;
}

Assistant:

int eia608_parse_preamble(uint16_t cc_data, int* row, int* col, eia608_style_t* style, int* chan, int* underline)
{
    (*row) = eia608_row_map[((0x0700 & cc_data) >> 7) | ((0x0020 & cc_data) >> 5)];
    (*chan) = !!(0x0800 & cc_data);
    (*underline) = 0x0001 & cc_data;

    if (0x0010 & cc_data) {
        (*style) = eia608_style_white;
        (*col) = 4 * ((0x000E & cc_data) >> 1);
    } else {
        (*style) = (0x000E & cc_data) >> 1;
        (*col) = 0;
    }

    return 1;
}